

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

CScript * __thiscall CScript::operator=(CScript *this,CScript *param_2)

{
  long lVar1;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=(in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CScript *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline void AppendDataSize(const uint32_t size)
    {
        if (size < OP_PUSHDATA1) {
            insert(end(), static_cast<value_type>(size));
        } else if (size <= 0xff) {
            insert(end(), OP_PUSHDATA1);
            insert(end(), static_cast<value_type>(size));
        } else if (size <= 0xffff) {
            insert(end(), OP_PUSHDATA2);
            value_type data[2];
            WriteLE16(data, size);
            insert(end(), std::cbegin(data), std::cend(data));
        } else {
            insert(end(), OP_PUSHDATA4);
            value_type data[4];
            WriteLE32(data, size);
            insert(end(), std::cbegin(data), std::cend(data));
        }
    }